

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O3

void __thiscall QMetaEnumBuilder::setMetaType(QMetaEnumBuilder *this,QMetaType metaType)

{
  QMetaEnumBuilderPrivate *pQVar1;
  uint uVar2;
  
  pQVar1 = d_func(this);
  if (pQVar1 != (QMetaEnumBuilderPrivate *)0x0) {
    (pQVar1->metaType).d_ptr = metaType.d_ptr;
    uVar2 = 0;
    if (metaType.d_ptr != (QMetaTypeInterface *)0x0) {
      uVar2 = (uint)(4 < (metaType.d_ptr)->size) << 6;
    }
    pQVar1 = d_func(this);
    if (pQVar1 != (QMetaEnumBuilderPrivate *)0x0) {
      (pQVar1->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
      super_QFlagsStorage<QtMocConstants::EnumFlags>.i =
           (pQVar1->flags).super_QFlagsStorageHelper<QtMocConstants::EnumFlags,_4>.
           super_QFlagsStorage<QtMocConstants::EnumFlags>.i & 0xffffffbf | uVar2;
    }
  }
  return;
}

Assistant:

void QMetaEnumBuilder::setMetaType(QMetaType metaType)
{
    QMetaEnumBuilderPrivate *d = d_func();
    if (d) {
        d->metaType = metaType;
        setIs64Bit(metaType.sizeOf() > 4);
    }
}